

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::getIrAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Addr> *addr)

{
  _func_int **pp_Var1;
  size_type sVar2;
  element_type *peVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar5;
  const_iterator cVar6;
  Reg *in_RDX;
  undefined **ppuVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<mocker::ir::IntLiteral> sVar8;
  shared_ptr<mocker::nasm::Addr> sVar9;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> local_38;
  
  sVar8 = ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                    (&local_38,(IntLiteral *)in_RDX);
  peVar3 = local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ppuVar7 = (undefined **)
            sVar8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pp_Var1 = local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr;
    puVar5 = (undefined8 *)operator_new(0x20);
    puVar5[1] = 0x100000001;
    *puVar5 = &PTR___Sp_counted_ptr_inplace_001efff8;
    ppuVar7 = &PTR__Addr_001f0048;
    puVar5[2] = &PTR__Addr_001f0048;
    puVar5[3] = pp_Var1;
    (this->irRegAddr).mp._M_h._M_buckets = (__buckets_ptr)(puVar5 + 2);
    (this->irRegAddr).mp._M_h._M_bucket_count = (size_type)puVar5;
  }
  if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    ppuVar7 = (undefined **)extraout_RDX;
  }
  if (peVar3 == (element_type *)0x0) {
    ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>(&local_38,in_RDX);
    iVar4 = std::__cxx11::string::compare
                      ((char *)(local_38.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 1));
    if (iVar4 == 0) {
      puVar5 = (undefined8 *)operator_new(0x20);
      puVar5[1] = 0x100000001;
      *puVar5 = &PTR___Sp_counted_ptr_inplace_001efff8;
      ppuVar7 = &PTR__Addr_001f0048;
      puVar5[2] = &PTR__Addr_001f0048;
      puVar5[3] = 0;
      (this->irRegAddr).mp._M_h._M_buckets = (__buckets_ptr)(puVar5 + 2);
      (this->irRegAddr).mp._M_h._M_bucket_count = (size_type)puVar5;
    }
    else {
      if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                      ,0x45,
                      "std::shared_ptr<nasm::Addr> mocker::(anonymous namespace)::FuncSelectionContext::getIrAddr(const std::shared_ptr<ir::Addr> &) const"
                     );
      }
      cVar6 = std::
              _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)addr,(key_type *)&local_38);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      (this->irRegAddr).mp._M_h._M_buckets =
           *(__buckets_ptr *)
            ((long)cVar6.
                   super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                   ._M_cur + 0x18);
      sVar2 = *(size_type *)
               ((long)cVar6.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                      ._M_cur + 0x20);
      (this->irRegAddr).mp._M_h._M_bucket_count = sVar2;
      ppuVar7 = (undefined **)extraout_RDX_00;
      if (sVar2 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
        }
      }
    }
    if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      ppuVar7 = (undefined **)extraout_RDX_01;
    }
  }
  sVar9.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar7;
  sVar9.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar9.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::Addr>
  getIrAddr(const std::shared_ptr<ir::Addr> &addr) const {
    if (auto p = ir::dyc<ir::IntLiteral>(addr)) {
      return std::make_shared<nasm::NumericConstant>(p->getVal());
    }
    auto reg = ir::dyc<ir::Reg>(addr);
    if (reg->getIdentifier() == ".phi_nan")
      return std::make_shared<nasm::NumericConstant>(0);
    assert(reg);
    return irRegAddr.getVReg(reg);
  }